

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QHash<int,_QVariant>_>::data(QList<QHash<int,_QVariant>_> *this)

{
  QArrayDataPointer<QHash<int,_QVariant>_> *this_00;
  QHash<int,_QVariant> *pQVar1;
  QArrayDataPointer<QHash<int,_QVariant>_> *in_RDI;
  
  detach((QList<QHash<int,_QVariant>_> *)0x156f9c);
  this_00 = (QArrayDataPointer<QHash<int,_QVariant>_> *)
            QArrayDataPointer<QHash<int,_QVariant>_>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QHash<int,_QVariant>_>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }